

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O3

void __thiscall
Commands::command_handler_register_init::command_handler_register_init
          (command_handler_register_init *this,bool master)

{
  this->master = master;
  if (command_handler_register_init::initialized == false) {
    command_handler_register_init::initialized = true;
    command_handler_register_instance = (undefined8 *)operator_new(0x68);
    command_handler_register_instance[2] = 0;
    command_handler_register_instance[3] = 0;
    command_handler_register_instance[4] = 0;
    command_handler_register_instance[5] = 0;
    command_handler_register_instance[6] = 0;
    command_handler_register_instance[7] = 0;
    command_handler_register_instance[10] = 0;
    command_handler_register_instance[0xb] = 0;
    *command_handler_register_instance = 0;
    command_handler_register_instance[1] = 0;
    command_handler_register_instance[8] = 0;
    command_handler_register_instance[9] = 0;
    command_handler_register_instance[3] = command_handler_register_instance + 1;
    command_handler_register_instance[4] = command_handler_register_instance + 1;
    command_handler_register_instance[6] = command_handler_register_instance + 0xc;
    command_handler_register_instance[7] = 1;
    *(undefined4 *)(command_handler_register_instance + 10) = 0x3f800000;
    command_handler_register_instance[0xb] = 0;
    command_handler_register_instance[0xc] = 0;
  }
  return;
}

Assistant:

command_handler_register_init(bool master = false)
			: master(master)
		{
			static bool initialized;

			if (!initialized)
			{
				initialized = true;
				init();
			}
		}